

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          bool syntheticEvents,WatcherInotify *parent,bool fromInternalEvent)

{
  FileInfo *this_00;
  FileWatchListener *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Error EVar5;
  bool *pbVar6;
  WatcherInotify *pWVar7;
  int *piVar8;
  ulong uVar9;
  ulong *puVar10;
  mapped_type *ppWVar11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  string *psVar14;
  undefined7 in_register_00000081;
  allocator local_2f1;
  WatcherInotify *local_2f0;
  WatchID local_2e8;
  ulong local_2e0;
  key_type *local_2d8;
  string dir;
  Lock l;
  WatcherInotify *local_2a0 [2];
  _Rb_tree_node_base *local_290;
  string link;
  Lock lock;
  string curPath;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  FileInfo fi;
  string local_70 [32];
  string local_50;
  
  local_2e8 = CONCAT44(local_2e8._4_4_,(int)CONCAT71(in_register_00000081,syntheticEvents));
  std::__cxx11::string::string((string *)&dir,(string *)directory);
  FileSystem::dirAddSlashAtEnd(&dir);
  FileInfo::FileInfo(&fi,&dir);
  bVar2 = FileInfo::isDirectory(&fi);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_d8,(string *)&dir);
    EVar5 = Errors::Log::createLastError(FileNotFound,&local_d8);
    psVar14 = &local_d8;
    goto LAB_001263f0;
  }
  bVar2 = FileInfo::isReadable(&fi);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_f8,(string *)&dir);
    EVar5 = Errors::Log::createLastError(FileNotReadable,&local_f8);
    psVar14 = &local_f8;
    goto LAB_001263f0;
  }
  iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&dir);
  if ((char)iVar4 != '\0') {
    std::__cxx11::string::string((string *)&local_118,(string *)directory);
    EVar5 = Errors::Log::createLastError(FileRepeated,&local_118);
    psVar14 = &local_118;
    goto LAB_001263f0;
  }
  if ((parent != (WatcherInotify *)0x0) && (bVar2 = FileSystem::isRemoteFS(&dir), bVar2)) {
    std::__cxx11::string::string((string *)&local_138,(string *)&dir);
    EVar5 = Errors::Log::createLastError(FileRemote,&local_138);
    psVar14 = &local_138;
    goto LAB_001263f0;
  }
  curPath._M_dataplus._M_p = (pointer)&curPath.field_2;
  curPath._M_string_length = 0;
  curPath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_158,(string *)&dir);
  FileSystem::getLinkRealPath(&link,&local_158,&curPath);
  std::__cxx11::string::~string((string *)&local_158);
  bVar2 = std::operator!=("",&link);
  if (bVar2) {
    if ((parent == (WatcherInotify *)0x0) ||
       (pbVar6 = FileWatcher::followSymlinks((this->super_FileWatcherImpl).mFileWatcher),
       *pbVar6 != false)) {
      iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&link);
      if ((char)iVar4 == '\0') {
        iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])(this,&curPath,&link);
        if ((char)iVar4 != '\0') {
          std::__cxx11::string::_M_assign((string *)&dir);
          goto LAB_00126055;
        }
        std::__cxx11::string::string((string *)&local_1b8,(string *)&dir);
        EVar5 = Errors::Log::createLastError(FileOutOfScope,&local_1b8);
        psVar14 = &local_1b8;
      }
      else {
        std::__cxx11::string::string((string *)&local_198,(string *)directory);
        EVar5 = Errors::Log::createLastError(FileRepeated,&local_198);
        psVar14 = &local_198;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_178,(string *)&dir);
      EVar5 = Errors::Log::createLastError(FileOutOfScope,&local_178);
      psVar14 = &local_178;
    }
LAB_001263d6:
    std::__cxx11::string::~string((string *)psVar14);
  }
  else {
LAB_00126055:
    EVar5 = inotify_add_watch(this->mFD,dir._M_dataplus._M_p,0x3ca);
    if (EVar5 < NoError) {
      piVar8 = __errno_location();
      if (*piVar8 == 2) {
        std::__cxx11::string::string((string *)&local_1d8,(string *)&dir);
        EVar5 = Errors::Log::createLastError(FileNotFound,&local_1d8);
        psVar14 = &local_1d8;
      }
      else {
        pcVar13 = strerror(*piVar8);
        std::__cxx11::string::string((string *)&local_1f8,pcVar13,(allocator *)&l);
        EVar5 = Errors::Log::createLastError(Unspecified,&local_1f8);
        psVar14 = &local_1f8;
      }
      goto LAB_001263d6;
    }
    pWVar7 = (WatcherInotify *)operator_new(0xc0);
    WatcherInotify::WatcherInotify(pWVar7);
    (pWVar7->super_Watcher).Listener = watcher;
    local_2e0 = (ulong)(uint)EVar5;
    uVar9 = local_2e0;
    if (parent != (WatcherInotify *)0x0) {
      uVar9 = (parent->super_Watcher).ID;
    }
    (pWVar7->super_Watcher).ID = uVar9;
    pWVar7->InotifyID = local_2e0;
    local_2d8 = &(pWVar7->super_Watcher).Directory;
    local_2f0 = pWVar7;
    std::__cxx11::string::_M_assign((string *)local_2d8);
    (pWVar7->super_Watcher).Recursive = recursive;
    pWVar7->Parent = parent;
    lock.mMutex = &this->mWatchesLock;
    Mutex::lock(lock.mMutex);
    l.mMutex._0_4_ = EVar5;
    local_2a0[0] = pWVar7;
    std::
    _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
    ::_M_emplace_unique<std::pair<int,efsw::WatcherInotify*>>
              ((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                *)&this->mWatches,(pair<int,_efsw::WatcherInotify_*> *)&l);
    puVar10 = (ulong *)std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&this->mWatchesRef,local_2d8);
    *puVar10 = local_2e0;
    Lock::~Lock(&lock);
    pWVar7 = local_2f0;
    if (local_2f0->Parent == (WatcherInotify *)0x0) {
      l.mMutex = &this->mRealWatchesLock;
      Mutex::lock(l.mMutex);
      ppWVar11 = std::
                 map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                 ::operator[](&this->mRealWatches,&pWVar7->InotifyID);
      *ppWVar11 = pWVar7;
      Lock::~Lock(&l);
    }
    if ((pWVar7->super_Watcher).Recursive == true) {
      std::__cxx11::string::string((string *)&local_218,(string *)local_2d8);
      FileSystem::filesInfoFromPath((FileInfoMap *)&l,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      local_2e0 = CONCAT44(local_2e0._4_4_,(uint)recursive);
      bVar2 = (bool)(byte)local_2e8;
      p_Var12 = local_290;
      while ((p_Var12 != (_Rb_tree_node_base *)local_2a0 &&
             (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) != 0))) {
        this_00 = (FileInfo *)(p_Var12 + 2);
        bVar3 = FileInfo::isDirectory(this_00);
        if ((bVar3) && (bVar3 = FileInfo::isReadable(this_00), bVar3)) {
          addWatch(this,(string *)this_00,watcher,SUB81(local_2e0,0),bVar2,local_2f0,false);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      }
      if (((parent != (WatcherInotify *)0x0 && fromInternalEvent) & (byte)local_2e8) == 1) {
        for (p_Var12 = local_290; p_Var12 != (_Rb_tree_node_base *)local_2a0;
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
          bVar2 = FileInfo::isRegularFile((FileInfo *)(p_Var12 + 2));
          if (bVar2) {
            local_2e8 = (local_2f0->super_Watcher).ID;
            pFVar1 = (local_2f0->super_Watcher).Listener;
            std::__cxx11::string::string((string *)&local_50,(string *)(p_Var12 + 2));
            FileSystem::fileNameFromPath((string *)&lock,&local_50);
            std::__cxx11::string::string(local_70,"",&local_2f1);
            (*pFVar1->_vptr_FileWatchListener[2])
                      (pFVar1,local_2e8,local_2d8,(string *)&lock,1,local_70);
            std::__cxx11::string::~string(local_70);
            std::__cxx11::string::~string((string *)&lock);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
                   *)&l);
    }
  }
  std::__cxx11::string::~string((string *)&link);
  psVar14 = &curPath;
LAB_001263f0:
  std::__cxx11::string::~string((string *)psVar14);
  std::__cxx11::string::~string((string *)&fi);
  std::__cxx11::string::~string((string *)&dir);
  return (long)EVar5;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, bool syntheticEvents,
									  WatcherInotify* parent, bool fromInternalEvent ) {
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() ) {
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	} else if ( !fi.isReadable() ) {
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	} else if ( pathInWatches( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRepeated, directory );
	} else if ( NULL != parent && FileSystem::isRemoteFS( dir ) ) {
		return Errors::Log::createLastError( Errors::FileRemote, dir );
	}

	/// Check if the directory is a symbolic link
	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link ) {
		/// Avoid adding symlinks directories if it's now enabled
		if ( NULL != parent && !mFileWatcher->followSymlinks() ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( pathInWatches( link ) ) {
			return Errors::Log::createLastError( Errors::FileRepeated, directory );
		} else if ( !linkAllowed( curPath, link ) ) {
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		} else {
			dir = link;
		}
	}

	int wd = inotify_add_watch( mFD, dir.c_str(),
								IN_CLOSE_WRITE | IN_MOVED_TO | IN_CREATE | IN_MOVED_FROM |
									IN_DELETE | IN_MODIFY );

	if ( wd < 0 ) {
		if ( errno == ENOENT ) {
			return Errors::Log::createLastError( Errors::FileNotFound, dir );
		} else {
			return Errors::Log::createLastError( Errors::Unspecified,
												 std::string( strerror( errno ) ) );
		}
	}

	efDEBUG( "Added watch %s with id: %d\n", dir.c_str(), wd );

	WatcherInotify* pWatch = new WatcherInotify();
	pWatch->Listener = watcher;
	pWatch->ID = parent ? parent->ID : wd;
	pWatch->InotifyID = wd;
	pWatch->Directory = dir;
	pWatch->Recursive = recursive;
	pWatch->Parent = parent;

	{
		Lock lock( mWatchesLock );
		mWatches.insert( std::make_pair( wd, pWatch ) );
		mWatchesRef[pWatch->Directory] = wd;
	}

	if ( NULL == pWatch->Parent ) {
		Lock l( mRealWatchesLock );
		mRealWatches[pWatch->InotifyID] = pWatch;
	}

	if ( pWatch->Recursive ) {
		std::map<std::string, FileInfo> files = FileSystem::filesInfoFromPath( pWatch->Directory );
		std::map<std::string, FileInfo>::iterator it = files.begin();

		for ( ; it != files.end(); ++it ) {
			if ( !mInitOK )
				break;

			const FileInfo& cfi = it->second;

			if ( cfi.isDirectory() && cfi.isReadable() ) {
				addWatch( cfi.Filepath, watcher, recursive, syntheticEvents, pWatch );
			}
		}

		if ( fromInternalEvent && parent != NULL && syntheticEvents ) {
			for ( const auto& file : files ) {
				if ( file.second.isRegularFile() ) {
					pWatch->Listener->handleFileAction(
						pWatch->ID, pWatch->Directory,
						FileSystem::fileNameFromPath( file.second.Filepath ), Actions::Add );
				}
			}
		}
	}

	return wd;
}